

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

bool __thiscall
QMetaMethod::invokeImpl
          (QMetaMethod *this,QMetaMethod self,void *target,ConnectionType connectionType,
          qsizetype paramCount,void **parameters,char **typeNames,QMetaTypeInterface **metaTypes)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  InvokeFailReason IVar4;
  void *pvVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QMetaObject *in_stack_ffffffffffffff48;
  Data local_b0;
  QMessageLogger local_a0;
  QByteArray local_80;
  QMessageLogger local_68;
  QMetaMethod self_local;
  
  self_local.data.d = (uint *)self.mobj;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  self_local.mobj = (QMetaObject *)this;
  if (this != (QMetaMethod *)0x0 && self.data.d.d != (uint *)0x0) {
    IVar4 = QMetaMethodInvoker::invokeImpl
                      ((QMetaMethodInvoker *)this,self,target,connectionType,paramCount,parameters,
                       typeNames,(QMetaTypeInterface **)in_stack_ffffffffffffff48);
    bVar6 = IVar4 == None;
    if (bVar6) goto LAB_00286331;
    if (~CouldNotQueueParameter < IVar4) {
      local_68.context.version = 2;
      local_68.context._4_8_ = 0;
      local_68.context._12_8_ = 0;
      local_68.context.function._4_4_ = 0;
      local_68.context.category = "default";
      pvVar5 = parameters[(uint)(IVar4 + (CouldNotQueueParameter|TooFewArguments))];
      if (pvVar5 == (void *)0x0) {
        pvVar5 = *(void **)(typeNames[(uint)(IVar4 + (CouldNotQueueParameter|TooFewArguments))] +
                           0x18);
      }
      puVar3 = (this->data).d;
      uVar1 = puVar3[(long)*(int *)((long)&((this[1].mobj)->d).superdata.direct + 4) * 2];
      methodSignature(&local_80,&self_local);
      if ((uint *)local_80.d.ptr == (uint *)0x0) {
        local_80.d.ptr = "";
      }
      QMessageLogger::warning
                (&local_68,
                 "QMetaMethod::invoke: cannot convert formal parameter %d from %s in call to %s::%s"
                 ,(ulong)(uint)(IVar4 + CouldNotQueueParameter),pvVar5,(ulong)uVar1 + (long)puVar3,
                 local_80.d.ptr);
      invokeImpl((QMetaMethod *)&local_80);
    }
    if (IVar4 == TooFewArguments) {
      local_a0.context.version = 2;
      local_a0.context._4_8_ = 0;
      local_a0.context._12_8_ = 0;
      local_a0.context.function._4_4_ = 0;
      local_a0.context.category = "default";
      puVar3 = ((self_local.mobj)->d).stringdata;
      uVar1 = puVar3[(long)(int)((self_local.mobj)->d).data[1] * 2];
      methodSignature((QByteArray *)&stack0xffffffffffffff48,&self_local);
      if (local_b0.d == (uint *)0x0) {
        local_b0.d = (uint *)0x4e8460;
      }
      QMessageLogger::warning
                (&local_a0,"QMetaMethod::invoke: too few arguments (%d) in call to %s::%s",
                 connectionType,(ulong)uVar1 + (long)puVar3,local_b0.d);
      invokeImpl((QMetaMethod *)&stack0xffffffffffffff48);
    }
  }
  bVar6 = false;
LAB_00286331:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaMethod::invokeImpl(QMetaMethod self, void *target, Qt::ConnectionType connectionType,
                             qsizetype paramCount, const void *const *parameters,
                             const char *const *typeNames,
                             const QtPrivate::QMetaTypeInterface *const *metaTypes)
{
    if (!target || !self.mobj)
        return false;
    QMetaMethodPrivate::InvokeFailReason r =
            QMetaMethodPrivate::invokeImpl(self, target, connectionType, paramCount, parameters,
                                           typeNames, metaTypes);
    if (Q_LIKELY(r == QMetaMethodPrivate::InvokeFailReason::None))
        return true;

    if (int(r) >= int(QMetaMethodPrivate::InvokeFailReason::FormalParameterMismatch)) {
        int n = int(r) - int(QMetaMethodPrivate::InvokeFailReason::FormalParameterMismatch);
        qWarning("QMetaMethod::invoke: cannot convert formal parameter %d from %s in call to %s::%s",
                 n, typeNames[n + 1] ? typeNames[n + 1] : metaTypes[n + 1]->name,
                 self.mobj->className(), self.methodSignature().constData());
    }
    if (r == QMetaMethodPrivate::InvokeFailReason::TooFewArguments) {
        qWarning("QMetaMethod::invoke: too few arguments (%d) in call to %s::%s",
                 int(paramCount), self.mobj->className(), self.methodSignature().constData());
    }
    return false;
}